

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall
PrintfTest_SwitchArgIndexing_Test::~PrintfTest_SwitchArgIndexing_Test
          (PrintfTest_SwitchArgIndexing_Test *this)

{
  void *in_RDI;
  
  ~PrintfTest_SwitchArgIndexing_Test((PrintfTest_SwitchArgIndexing_Test *)0x140668);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(PrintfTest, SwitchArgIndexing) {
  EXPECT_THROW_MSG(test_sprintf("%1$d%", 1, 2),
      format_error, "cannot switch from manual to automatic argument indexing");
  EXPECT_THROW_MSG(test_sprintf(format("%1$d%{}d", BIG_NUM), 1, 2),
      format_error, "number is too big");
  EXPECT_THROW_MSG(test_sprintf("%1$d%d", 1, 2),
      format_error, "cannot switch from manual to automatic argument indexing");

  EXPECT_THROW_MSG(test_sprintf("%d%1$", 1, 2),
      format_error, "cannot switch from automatic to manual argument indexing");
  EXPECT_THROW_MSG(test_sprintf(format("%d%{}$d", BIG_NUM), 1, 2),
      format_error, "number is too big");
  EXPECT_THROW_MSG(test_sprintf("%d%1$d", 1, 2),
      format_error, "cannot switch from automatic to manual argument indexing");

  // Indexing errors override width errors.
  EXPECT_THROW_MSG(test_sprintf(format("%d%1${}d", BIG_NUM), 1, 2),
      format_error, "number is too big");
  EXPECT_THROW_MSG(test_sprintf(format("%1$d%{}d", BIG_NUM), 1, 2),
      format_error, "number is too big");
}